

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

htmlDocPtr
htmlCtxtReadIO(htmlParserCtxtPtr ctxt,xmlInputReadCallback ioread,xmlInputCloseCallback ioclose,
              void *ioctx,char *URL,char *encoding,int options)

{
  xmlParserInputBufferPtr input_00;
  xmlParserInputPtr value;
  xmlParserInputPtr stream;
  xmlParserInputBufferPtr input;
  char *encoding_local;
  char *URL_local;
  void *ioctx_local;
  xmlInputCloseCallback ioclose_local;
  xmlInputReadCallback ioread_local;
  htmlParserCtxtPtr ctxt_local;
  
  if (ioread == (xmlInputReadCallback)0x0) {
    ctxt_local = (htmlParserCtxtPtr)0x0;
  }
  else if (ctxt == (htmlParserCtxtPtr)0x0) {
    ctxt_local = (htmlParserCtxtPtr)0x0;
  }
  else {
    xmlInitParser();
    htmlCtxtReset(ctxt);
    input_00 = xmlParserInputBufferCreateIO(ioread,ioclose,ioctx,XML_CHAR_ENCODING_NONE);
    if (input_00 == (xmlParserInputBufferPtr)0x0) {
      if (ioclose != (xmlInputCloseCallback)0x0) {
        (*ioclose)(ioctx);
      }
      ctxt_local = (htmlParserCtxtPtr)0x0;
    }
    else {
      value = xmlNewIOInputStream(ctxt,input_00,XML_CHAR_ENCODING_NONE);
      if (value == (xmlParserInputPtr)0x0) {
        xmlFreeParserInputBuffer(input_00);
        ctxt_local = (htmlParserCtxtPtr)0x0;
      }
      else {
        inputPush(ctxt,value);
        ctxt_local = (htmlParserCtxtPtr)htmlDoRead(ctxt,URL,encoding,options,1);
      }
    }
  }
  return (htmlDocPtr)ctxt_local;
}

Assistant:

htmlDocPtr
htmlCtxtReadIO(htmlParserCtxtPtr ctxt, xmlInputReadCallback ioread,
              xmlInputCloseCallback ioclose, void *ioctx,
	      const char *URL,
              const char *encoding, int options)
{
    xmlParserInputBufferPtr input;
    xmlParserInputPtr stream;

    if (ioread == NULL)
        return (NULL);
    if (ctxt == NULL)
        return (NULL);
    xmlInitParser();

    htmlCtxtReset(ctxt);

    input = xmlParserInputBufferCreateIO(ioread, ioclose, ioctx,
                                         XML_CHAR_ENCODING_NONE);
    if (input == NULL) {
        if (ioclose != NULL)
            ioclose(ioctx);
        return (NULL);
    }
    stream = xmlNewIOInputStream(ctxt, input, XML_CHAR_ENCODING_NONE);
    if (stream == NULL) {
        xmlFreeParserInputBuffer(input);
        return (NULL);
    }
    inputPush(ctxt, stream);
    return (htmlDoRead(ctxt, URL, encoding, options, 1));
}